

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O2

bool spvExtInstIsNonSemantic(spv_ext_inst_type_t type)

{
  return type - SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION < 4;
}

Assistant:

bool spvExtInstIsNonSemantic(const spv_ext_inst_type_t type) {
  if (type == SPV_EXT_INST_TYPE_NONSEMANTIC_UNKNOWN ||
      type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100 ||
      type == SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION ||
      type == SPV_EXT_INST_TYPE_NONSEMANTIC_VKSPREFLECTION) {
    return true;
  }
  return false;
}